

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.hpp
# Opt level: O3

void __thiscall
afsm::
priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
::enqueue_event<afsm::test::events::begin>
          (priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
           *this,begin *event,event_priority_type priority)

{
  mutex_type *__mutex;
  test_fsm_observer *this_00;
  int iVar1;
  undefined8 uVar2;
  event_priority_type local_2c;
  anon_class_16_3_3ecbcd59 local_28;
  
  __mutex = &this->mutex_;
  local_2c = priority;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 == 0) {
    LOCK();
    (this->queue_size_).super___atomic_base<unsigned_long>._M_i =
         (this->queue_size_).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
    this_00 = (this->super_observer_wrapper<afsm::test::test_fsm_observer>).observer_.
              super___shared_ptr<afsm::test::test_fsm_observer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (this_00 != (test_fsm_observer *)0x0) {
      test::test_fsm_observer::
      enqueue_event<afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::test::events::begin>
                (this_00,this,event);
    }
    local_28.priority = local_2c;
    local_28.this = this;
    std::
    vector<std::pair<std::function<afsm::actions::event_process_result()>,int>,std::allocator<std::pair<std::function<afsm::actions::event_process_result()>,int>>>
    ::
    emplace_back<afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>::enqueue_event<afsm::test::events::begin>(afsm::test::events::begin&&,int)::_lambda()_1_,int&>
              ((vector<std::pair<std::function<afsm::actions::event_process_result()>,int>,std::allocator<std::pair<std::function<afsm::actions::event_process_result()>,int>>>
                *)&this->queued_events_,&local_28,&local_2c);
    std::
    push_heap<__gnu_cxx::__normal_iterator<std::pair<std::function<afsm::actions::event_process_result()>,int>*,std::vector<std::pair<std::function<afsm::actions::event_process_result()>,int>,std::allocator<std::pair<std::function<afsm::actions::event_process_result()>,int>>>>,afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>::event_comparison>
              ((this->queued_events_).c.
               super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (this->queued_events_).c.
               super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    process_event_queue(this);
    return;
  }
  uVar2 = std::__throw_system_error(iVar1);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar2);
}

Assistant:

void
    enqueue_event(Event&& event, event_priority_type priority)
    {
        {
            lock_guard lock{mutex_};
            ++queue_size_;
            observer_wrapper::enqueue_event(*this, ::std::forward<Event>(event));
            Event evt{::std::forward<Event>(event)};
            queued_events_.emplace([&, evt, priority]() mutable {
                return process_event_dispatch(::std::move(evt), priority);
            }, priority);
        }
        // Process enqueued events in case we've been waiting for queue
        // mutex release
        process_event_queue();
    }